

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

example * __thiscall VW::ptr_queue<example>::pop(ptr_queue<example> *this)

{
  queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *this_00;
  byte bVar1;
  size_type sVar2;
  example *peVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->mut);
  this_00 = &this->object_queue;
  while (bVar1 = this->done, (bool)bVar1 == false) {
    sVar2 = std::deque<example_*,_std::allocator<example_*>_>::size(&this_00->c);
    if (sVar2 != 0) {
      bVar1 = this->done;
      break;
    }
    std::condition_variable::wait((unique_lock *)&this->is_not_empty);
  }
  if ((bVar1 & 1) != 0) {
    sVar2 = std::deque<example_*,_std::allocator<example_*>_>::size(&this_00->c);
    if (sVar2 == 0) {
      peVar3 = (example *)0x0;
      goto LAB_00196c6f;
    }
  }
  peVar3 = *(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  std::deque<example_*,_std::allocator<example_*>_>::pop_front(&this_00->c);
  std::unique_lock<std::mutex>::unlock(&local_30);
  std::condition_variable::notify_all();
LAB_00196c6f:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return peVar3;
}

Assistant:

T* pop()
    {
      std::unique_lock<std::mutex> lock(mut);
      while (!done && object_queue.size() == 0)
      {
        is_not_empty.wait(lock);
      }

      if (done && object_queue.size() == 0)
      {
        return nullptr;
      }

      auto item = object_queue.front();
      object_queue.pop();

      lock.unlock();
      is_not_full.notify_all();
      return item;
    }